

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,int num_digits,
          string_view prefix,basic_format_specs<char> *spec,num_writer f)

{
  undefined4 uVar1;
  type tVar2;
  alignment aVar3;
  uint uVar4;
  size_t sVar5;
  int in_ESI;
  align_spec *in_R8;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *in_stack_00000008;
  undefined4 in_stack_00000010;
  align_spec as;
  size_t padding;
  char_type fill;
  size_t size;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  basic_string_view<char> local_10;
  
  sVar5 = basic_string_view<char>::size(&local_10);
  tVar2 = internal::to_unsigned<int>(in_ESI);
  align_spec::fill(in_R8);
  aVar3 = align_spec::align(in_R8);
  if (aVar3 == ALIGN_NUMERIC) {
    uVar4 = align_spec::width(in_R8);
    if (sVar5 + tVar2 < (ulong)uVar4) {
      align_spec::width(in_R8);
      align_spec::width(in_R8);
    }
  }
  else if (in_ESI < (int)in_R8[1].width_) {
    basic_string_view<char>::size(&local_10);
    internal::to_unsigned<int>(in_R8[1].width_);
    internal::to_unsigned<int>(in_R8[1].width_ - in_ESI);
  }
  uVar1 = in_R8->width_;
  align_spec::align(in_R8);
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>>
            ((basic_writer<fmt::v5::output_range<char_*,_char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffb0),
             (align_spec *)CONCAT44(in_stack_ffffffffffffffac,in_stack_00000010),in_stack_00000008);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }